

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O1

pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> __thiscall
wasm::UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
::pop(UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
      *this)

{
  __hashtable *__h;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar1;
  FlowBlock *local_30;
  uint local_28;
  unordered_set<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
  *local_20;
  __node_gen_type __node_gen;
  
  pVar1 = UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::pop
                    (&this->
                      super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                    );
  local_30 = pVar1.first;
  local_28 = pVar1.second;
  local_20 = &this->processed;
  std::
  _Hashtable<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>,std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>,std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>>,std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>,true>>>>
            ((_Hashtable<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>,std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>,std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>>,std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock*,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_20,&local_30);
  pVar1.second = local_28;
  pVar1.first = local_30;
  pVar1._12_4_ = 0;
  return pVar1;
}

Assistant:

T pop() {
    T ret = UniqueDeferredQueue<T>::pop();
    processed.insert(ret);
    return ret;
  }